

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O2

int Min_CubesDistTwo(Min_Cube_t *pCube0,Min_Cube_t *pCube1,int *pVar0,int *pVar1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar2 = 0xffffffff;
  uVar5 = 0;
  uVar6 = 0;
  uVar4 = 0xffffffff;
  do {
    if (uVar6 == (*(uint *)&pCube0->field_0x8 >> 10 & 0xfff)) {
      if ((int)(uVar2 | uVar4) < 0) {
        iVar3 = 0;
        if (uVar4 == 0xffffffff || uVar2 == 0xffffffff) {
          putchar(10);
          Min_CubeWrite(_stdout,pCube0);
          Min_CubeWrite(_stdout,pCube1);
          puts("Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!");
        }
      }
      else {
        *pVar0 = uVar2;
        *pVar1 = uVar4;
        iVar3 = 1;
      }
      return iVar3;
    }
    if (pCube0->uData[uVar6] != pCube1->uData[uVar6]) {
      if (-1 < (int)(uVar2 | uVar4)) {
        return 0;
      }
      uVar7 = pCube1->uData[uVar6] ^ pCube0->uData[uVar6];
      uVar7 = uVar7 >> 1 | uVar7;
      if ((-1 < (int)(uVar2 & uVar4)) && (uVar8 = uVar7 & 0x55555555, (uVar8 & uVar8 - 1) != 0)) {
        return 0;
      }
      uVar8 = uVar5;
      for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 2) {
        uVar1 = uVar2;
        if ((((uVar7 >> (uVar9 & 0x1f) & 1) != 0) && (uVar1 = uVar8, uVar2 != 0xffffffff)) &&
           (bVar10 = uVar4 != 0xffffffff, uVar1 = uVar2, uVar4 = uVar8, bVar10)) {
          return 0;
        }
        uVar2 = uVar1;
        uVar8 = uVar8 + 1;
      }
    }
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 0x10;
  } while( true );
}

Assistant:

static inline int Min_CubesDistTwo( Min_Cube_t * pCube0, Min_Cube_t * pCube1, int * pVar0, int * pVar1 )
{
    unsigned uData;//, uData2;
    int i, k, Var0 = -1, Var1 = -1;
    for ( i = 0; i < (int)pCube0->nWords; i++ )
    {
        uData = pCube0->uData[i] ^ pCube1->uData[i];
        if ( uData == 0 )
            continue;
        if ( Var0 >= 0 && Var1 >= 0 ) // more than two 1s
            return 0;
        uData = (uData | (uData >> 1)) & 0x55555555;
        if ( (Var0 >= 0 || Var1 >= 0) && (uData & (uData-1)) > 0 )
            return 0;
        for ( k = 0; k < 32; k += 2 )
            if ( uData & (1 << k) )
            {
                if ( Var0 == -1 )
                    Var0 = 16 * i + k/2;
                else if ( Var1 == -1 )
                    Var1 = 16 * i + k/2;
                else
                    return 0;
            }
        /*
        if ( Var0 >= 0 )
        {
            uData &= 0xFFFF;
            uData2 = (uData >> 16);
            if ( uData && uData2 )
                return 0;
            if ( uData )
            {
            }
            uData }= uData2;
            uData &= 0x
        }
        */
    }
    if ( Var0 >= 0 && Var1 >= 0 )
    {
        *pVar0 = Var0;
        *pVar1 = Var1;
        return 1;
    }
    if ( Var0 == -1 || Var1 == -1 )
    {
        printf( "\n" );
        Min_CubeWrite( stdout, pCube0 );
        Min_CubeWrite( stdout, pCube1 );
        printf( "Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!\n" );
    }
    return 0;
}